

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bels.c
# Opt level: O0

err_t belsGenMid(octet *mid,size_t len,octet *m0,octet *id,size_t id_len)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  long lVar3;
  bool_t bVar4;
  word *a;
  void *buf;
  size_t count;
  size_t sVar5;
  word *b;
  word *a_00;
  void *in_RCX;
  word *mod;
  void *in_RDX;
  ulong in_RSI;
  void *in_RDI;
  word *in_R8;
  void *stack;
  word *u;
  word *f;
  word *f0;
  void *state;
  size_t reps;
  size_t n;
  void *in_stack_ffffffffffffff78;
  u64 *in_stack_ffffffffffffff80;
  word *dest;
  word *n_00;
  word *pwVar6;
  err_t local_4;
  
  if (((((in_RSI == 0x10) || (in_RSI == 0x18)) || (in_RSI == 0x20)) &&
      ((bVar4 = memIsValid(in_RDX,in_RSI), bVar4 != 0 &&
       (bVar4 = memIsValid(in_RDI,in_RSI), bVar4 != 0)))) &&
     (bVar4 = memIsValid(in_RCX,(size_t)in_R8), bVar4 != 0)) {
    a = (word *)(in_RSI + 7 >> 3);
    buf = (void *)(((long)a * 2 + 2) * 8 + 0x28);
    count = beltHash_keep();
    sVar5 = ppMinPolyMod_deep((size_t)in_stack_ffffffffffffff80);
    utilMax(2,count,sVar5);
    b = (word *)blobCreate((size_t)in_stack_ffffffffffffff78);
    if (b == (word *)0x0) {
      local_4 = 0x6e;
    }
    else {
      a_00 = b + (long)a + 1;
      lVar3 = (long)a + 1;
      n_00 = b;
      u64From(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,0x145f83);
      b[(long)a] = 1;
      beltHashStart(in_stack_ffffffffffffff80);
      beltHashStepH(buf,count,in_stack_ffffffffffffff80);
      beltHashStepG((octet *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
      u64From(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,0x145fd6);
      (a_00 + lVar3)[(long)a] = 0;
      auVar1._8_8_ = 0;
      auVar1._0_8_ = in_RSI;
      if (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x80)) / auVar1,0) >> 3 < 3) {
        dest = (word *)0x3;
        pwVar6 = dest;
      }
      else {
        auVar2._8_8_ = 0;
        auVar2._0_8_ = in_RSI;
        dest = (word *)(SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x80)) / auVar2,0) >> 3);
        pwVar6 = dest;
      }
      while (mod = (word *)((long)pwVar6 - 1), pwVar6 != (word *)0x0) {
        ppMinPolyMod(in_R8,a,mod,(size_t)n_00,b);
        if ((a_00[(long)a] == 1) && (bVar4 = wwEq(a_00,b,(size_t)a), bVar4 == 0)) {
          u64To(dest,(size_t)in_stack_ffffffffffffff78,(u64 *)0x1460ab);
          break;
        }
        zzAddW2(a_00 + lVar3,(size_t)a,1);
        pwVar6 = mod;
      }
      blobClose((blob_t)0x1460d0);
      local_4 = 0x1f9;
      if (mod != (word *)0xffffffffffffffff) {
        local_4 = 0;
      }
    }
  }
  else {
    local_4 = 0x6d;
  }
  return local_4;
}

Assistant:

err_t belsGenMid(octet mid[], size_t len, const octet m0[], const octet id[], 
	size_t id_len)
{
	size_t n, reps;
	void* state;
	word* f0;
	word* f;
	word* u;
	void* stack;
	// проверить входные данные
	if ((len != 16 && len != 24 && len != 32) || 
		!memIsValid(m0, len) || !memIsValid(mid, len) || 
		!memIsValid(id, id_len))
		return ERR_BAD_INPUT;
	EXPECT(belsValM(m0, len) == ERR_OK);
	// создать состояние
	n = W_OF_O(len);
	state = blobCreate(O_OF_W(2 * n + 2) + 32 + O_PER_W +
		utilMax(2, 
			beltHash_keep(),
			ppMinPolyMod_deep(n + 1)));
	if (state == 0)
		return ERR_OUTOFMEMORY;
	// раскладка состояния
	f0 = (word*)state;
	f = f0 + n + 1;
	u = f + n + 1;
	stack = u + W_OF_O(32) + 1;
	// загрузить многочлен
	wwFrom(f0, m0, len);
	f0[n] = 1;
	// хэшировать
	beltHashStart(stack);
	beltHashStepH(id, id_len, stack);
	beltHashStepG((octet*)u, stack);
	wwFrom(u, u, 32);
	u[n] = 0;
	// попытки генерации
	for (reps = MAX2(3, B_PER_IMPOSSIBLE * 2 / len / 8); reps--;)
	{
		// f <- минимальный многочлен элемента u
		ppMinPolyMod(f, u, f0, n + 1, stack);
		// f подходит?
		if (f[n] == 1 && !wwEq(f, f0, n))
		{
			wwTo(mid, len, f);
			break;
		}
		// u <- u + 1
		zzAddW2(u, n, 1);
	}
	// завершение
	blobClose(state);
	return reps != SIZE_MAX ? ERR_OK : ERR_BAD_PUBKEY;
}